

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-thread-equal.c
# Opt level: O0

int run_test_thread_equal(void)

{
  int iVar1;
  undefined1 local_18 [8];
  uv_thread_t threads [2];
  
  main_thread_id = uv_thread_self();
  iVar1 = uv_thread_equal(&main_thread_id);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-thread-equal.c"
            ,0x26,"0 != uv_thread_equal(&main_thread_id, &main_thread_id)");
    abort();
  }
  iVar1 = uv_thread_create(local_18,check_thread,subthreads);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-thread-equal.c"
            ,0x27,"0 == uv_thread_create(threads + 0, check_thread, subthreads + 0)");
    abort();
  }
  iVar1 = uv_thread_create(threads,check_thread,0x4ee7d8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-thread-equal.c"
            ,0x28,"0 == uv_thread_create(threads + 1, check_thread, subthreads + 1)");
    abort();
  }
  iVar1 = uv_thread_join(local_18);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-thread-equal.c"
            ,0x29,"0 == uv_thread_join(threads + 0)");
    abort();
  }
  iVar1 = uv_thread_join(threads);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-thread-equal.c"
            ,0x2a,"0 == uv_thread_join(threads + 1)");
    abort();
  }
  iVar1 = uv_thread_equal(subthreads,0x4ee7d8);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-thread-equal.c"
            ,0x2b,"0 == uv_thread_equal(subthreads + 0, subthreads + 1)");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(thread_equal) {
  uv_thread_t threads[2];
  main_thread_id = uv_thread_self();
  ASSERT(0 != uv_thread_equal(&main_thread_id, &main_thread_id));
  ASSERT(0 == uv_thread_create(threads + 0, check_thread, subthreads + 0));
  ASSERT(0 == uv_thread_create(threads + 1, check_thread, subthreads + 1));
  ASSERT(0 == uv_thread_join(threads + 0));
  ASSERT(0 == uv_thread_join(threads + 1));
  ASSERT(0 == uv_thread_equal(subthreads + 0, subthreads + 1));
  return 0;
}